

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen8TextureCalc::FillTex2D
          (GmmGen8TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint8_t uVar32;
  int iVar33;
  int iVar34;
  SKU_FEATURE_TABLE *pSVar35;
  WA_TABLE *pWVar36;
  long lVar37;
  uint local_13c;
  uint local_138;
  uint32_t local_12c;
  uint local_128;
  uint32_t local_124;
  uint32_t local_118;
  uint32_t local_10c;
  uint32_t local_100;
  uint32_t local_f8;
  uint32_t local_f0;
  uint32_t local_ec;
  uint32_t local_e8;
  uint32_t local_e4;
  uint32_t local_d8;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  int local_c8;
  int local_c0;
  undefined4 local_bc;
  uint64_t SkipMip0Tiles;
  uint32_t i;
  uint32_t TRTileHeight;
  uint32_t TRTileWidth;
  uint32_t RowFactor;
  uint32_t ColFactor;
  uint32_t Modulo10;
  uint32_t Width1;
  uint32_t AlignedWidthLod2;
  uint32_t AlignedWidthLod1;
  uint32_t LCM;
  uint32_t Slice0Delta;
  uint32_t Mip0BlockHeight;
  uint32_t Height1;
  uint32_t Height0;
  bool csRestrictionsMet;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  uint uStack_54;
  uint8_t Compress;
  uint32_t Pitch;
  uint32_t ExpandedArraySize;
  uint32_t BlockHeight;
  uint32_t AlignedWidth;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t BitsPerPixel;
  uint32_t Height;
  uint32_t Width;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen8TextureCalc *this_local;
  
  pPlatform._7_1_ = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    _Height = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    _Height0 = GmmGetPlatformInfo((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.
                                  pGmmLibContext);
    VAlign = pRestrictions_local->RenderPitchAlignment;
    HAlign = pRestrictions_local->MinHeight;
    uVar2 = pRestrictions_local->MinAllocationSize;
    BitsPerPixel = (uint32_t)uVar2;
    if (*(uint *)((long)&pRestrictions_local->MaxHeight + 4) < 2) {
      local_bc = 1;
    }
    else {
      local_bc = *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4) = local_bc;
    if (*(uint *)((long)&pRestrictions_local->MinWidth + 4) < 2) {
      local_c0 = 1;
    }
    else {
      local_c0 = *(int *)((long)&pRestrictions_local->MinWidth + 4);
    }
    iVar33 = 1;
    if (pRestrictions_local->Alignment == 4) {
      iVar33 = 6;
    }
    uVar3._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar3._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar3 >> 6 & 1) == 0) &&
       (uVar4._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar4._4_4_ = pRestrictions_local->MinPitch, (uVar4 >> 0x1d & 1) == 0)) {
      local_c8 = *(int *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    else {
      local_c8 = 1;
    }
    uStack_54 = local_c0 * iVar33 * local_c8;
    uVar5._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar5._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar5 >> 3 & 1) != 0) ||
       (uVar6._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar6._4_4_ = pRestrictions_local->MinPitch, (uVar6 >> 4 & 1) != 0)) {
      local_c9 = false;
      if (((uStack_54 < 3) &&
          (local_c9 = false, uStack_54 == *(uint *)((long)&pRestrictions_local->MinWidth + 4))) &&
         ((((pRestrictions_local->PitchAlignment == 0x7e ||
            (pRestrictions_local->PitchAlignment == 0x7f)) ||
           (pRestrictions_local->PitchAlignment == 0x17)) ||
          (((pRestrictions_local->PitchAlignment == 0x18 ||
            (pRestrictions_local->PitchAlignment == 0x19)) ||
           (local_c9 = false, pRestrictions_local->PitchAlignment == 0x1a)))))) {
        uVar7._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar7._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar7 >> 3 & 1) == 0) || (local_ca = true, (uVar2 & 0xf) != 0)) {
          uVar2._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar2._4_4_ = pRestrictions_local->MinPitch;
          local_cb = (uVar2 >> 4 & 1) != 0 && BitsPerPixel % 0xc == 0;
          local_ca = local_cb;
        }
        local_c9 = local_ca;
      }
      Height1._3_1_ = local_c9;
      if (local_c9 == false) {
        uVar8._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar8._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar8 & 0xfffffffffffffff7);
        pRestrictions_local->MinPitch = (int)((uVar8 & 0xfffffffffffffff7) >> 0x20);
        uVar9._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar9._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar9 & 0xffffffffffffffef);
        pRestrictions_local->MinPitch = (int)((uVar9 & 0xffffffffffffffef) >> 0x20);
      }
      else {
        uStack_54 = 4;
      }
    }
    CompressHeight = pRestrictions_local->MaxDepth;
    CompressWidth = pRestrictions_local->MaxArraySize;
    GmmTextureCalc::GetCompressionBlockDimensions
              ((GmmTextureCalc *)this,pRestrictions_local->PitchAlignment,&AlignedWidth,
               &CompressDepth,&BlockHeight);
    pPlatform._7_1_ =
         GmmIsCompressed((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext,
                         pRestrictions_local->PitchAlignment);
    if (uStack_54 < 2) {
      pRestrictions_local[1].LockPitchAlignment = 0;
      Pitch = (*(this->super_GmmGen7TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[6])
                        (this,pRestrictions_local);
    }
    else {
      AlignedWidthLod1 = 0;
      uVar10._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar10._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar10 >> 6 & 1) == 0) &&
         (uVar11._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar11._4_4_ = pRestrictions_local->MinPitch, (uVar11 >> 0x1d & 1) == 0)) {
        local_d8 = 1;
      }
      else {
        local_d8 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      Mip0BlockHeight =
           GmmTextureCalc::ExpandHeight((GmmTextureCalc *)this,HAlign,CompressWidth,local_d8);
      uVar12._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar12._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar12 >> 6 & 1) == 0) &&
         (uVar13._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar13._4_4_ = pRestrictions_local->MinPitch, (uVar13 >> 0x1d & 1) == 0)) {
        local_e4 = 1;
      }
      else {
        local_e4 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      Slice0Delta = GmmTextureCalc::ExpandHeight
                              ((GmmTextureCalc *)this,HAlign >> 1,CompressWidth,local_e4);
      if ((int)pRestrictions_local->MinWidth == 0) {
        local_e8 = Mip0BlockHeight;
      }
      else {
        local_e8 = Mip0BlockHeight + Slice0Delta + CompressWidth * 0xc;
      }
      LCM = local_e8;
      if ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 5 & 1) == 0) {
        local_ec = 0;
      }
      else {
        local_ec = Mip0BlockHeight;
      }
      Pitch = local_e8 - local_ec;
      uVar14._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar14._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar14 >> 0x19 & 1) != 0) &&
         (pSVar35 = Context::GetSkuTable
                              ((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.pGmmLibContext)
         , (*(byte *)&pSVar35->field_5 >> 1 & 1) != 0)) {
        Pitch = (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].
                          LogicalTileHeight - 1)) -
                (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].
                          LogicalTileHeight - 1) &
                _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1);
      }
      if ((pPlatform._7_1_ != '\0') && ((CompressDepth & 3) != 0)) {
        iVar33 = 2;
        if ((CompressDepth & 1) != 0) {
          iVar33 = 4;
        }
        AlignedWidthLod2 = CompressDepth * iVar33;
        if (AlignedWidthLod2 == 0) {
          local_f0 = Pitch;
        }
        else {
          local_f0 = Pitch + ((AlignedWidthLod2 - 1) -
                             (Pitch + (AlignedWidthLod2 - 1)) % AlignedWidthLod2);
        }
        Pitch = local_f0;
        if (AlignedWidthLod2 == 0) {
          local_f8 = LCM;
        }
        else {
          local_f8 = LCM + ((AlignedWidthLod2 - 1) -
                           (LCM + (AlignedWidthLod2 - 1)) % AlignedWidthLod2);
        }
        LCM = local_f8;
      }
      pRestrictions_local[1].LockPitchAlignment = Pitch;
      if (pPlatform._7_1_ == '\0') {
        uVar15._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar15._4_4_ = pRestrictions_local->MinPitch;
        if ((uVar15 >> 0x1d & 1) == 0) {
          uVar16._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar16._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar16 >> 1 & 1) != 0) {
            uVar17._0_4_ = pRestrictions_local->LockPitchAlignment;
            uVar17._4_4_ = pRestrictions_local->MinPitch;
            if ((uVar17 >> 0x29 & 1) == 0) {
              uVar18._0_4_ = pRestrictions_local->LockPitchAlignment;
              uVar18._4_4_ = pRestrictions_local->MinPitch;
              if ((uVar18 >> 0x28 & 1) != 0) {
                Pitch = Pitch >> 4;
              }
            }
            else {
              Pitch = Pitch >> 5;
            }
          }
        }
        else {
          Pitch = Pitch >> 1;
        }
      }
      else {
        Pitch = Pitch / CompressDepth;
        LCM = LCM / CompressDepth;
      }
      if ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 5 & 1) == 0) {
        local_100 = 0;
      }
      else {
        local_100 = LCM - Pitch;
      }
      AlignedWidthLod1 = local_100;
      Pitch = local_100 + uStack_54 * Pitch;
    }
    uVar19._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar19._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar19 >> 6 & 1) == 0) &&
       (uVar20._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar20._4_4_ = pRestrictions_local->MinPitch, (uVar20 >> 0x1d & 1) == 0)) {
      local_10c = 1;
    }
    else {
      local_10c = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    ExpandedArraySize =
         GmmTextureCalc::ExpandWidth((GmmTextureCalc *)this,BitsPerPixel,CompressHeight,local_10c);
    if (1 < (uint)pRestrictions_local->MinWidth) {
      uVar21._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar21._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar21 >> 6 & 1) == 0) &&
         (uVar22._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar22._4_4_ = pRestrictions_local->MinPitch, (uVar22 >> 0x1d & 1) == 0)) {
        local_118 = 1;
      }
      else {
        local_118 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      Width1 = GmmTextureCalc::ExpandWidth
                         ((GmmTextureCalc *)this,BitsPerPixel >> 1,CompressHeight,local_118);
      uVar23._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar23._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar23 >> 6 & 1) == 0) &&
         (uVar24._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar24._4_4_ = pRestrictions_local->MinPitch, (uVar24 >> 0x1d & 1) == 0)) {
        local_124 = 1;
      }
      else {
        local_124 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      Modulo10 = GmmTextureCalc::ExpandWidth
                           ((GmmTextureCalc *)this,BitsPerPixel >> 2,CompressHeight,local_124);
      pWVar36 = Context::GetWaTable((this->super_GmmGen7TextureCalc).super_GmmTextureCalc.
                                    pGmmLibContext);
      if (((((*(ulong *)&pWVar36->field_0x4 >> 0x25 & 1) != 0) ||
           ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 5 & 1) != 0)) &&
          (((uint)_Height0->FormatTable[pRestrictions_local->PitchAlignment].field_0 & 1) != 0)) &&
         (AlignedWidth == 5)) {
        if (BitsPerPixel == 1) {
          local_128 = 1;
        }
        else {
          local_128 = BitsPerPixel >> 1;
        }
        ColFactor = local_128;
        RowFactor = local_128 % 10;
        if ((RowFactor != 0) && (RowFactor < 6)) {
          Modulo10 = Modulo10 + 0xf;
        }
      }
      if (Width1 + Modulo10 < ExpandedArraySize) {
        local_12c = ExpandedArraySize;
      }
      else {
        local_12c = Width1 + Modulo10;
      }
      ExpandedArraySize = local_12c;
    }
    if (pPlatform._7_1_ == '\0') {
      uVar25._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar25._4_4_ = pRestrictions_local->MinPitch;
      if ((uVar25 >> 0x1d & 1) == 0) {
        uVar26._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar26._4_4_ = pRestrictions_local->MinPitch;
        if ((uVar26 >> 1 & 1) == 0) {
          uVar29._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar29._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar29 >> 3 & 1) == 0) {
            uVar30._0_4_ = pRestrictions_local->LockPitchAlignment;
            uVar30._4_4_ = pRestrictions_local->MinPitch;
            if ((uVar30 >> 4 & 1) != 0) {
              ExpandedArraySize =
                   (*(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize) / 3;
            }
          }
          else {
            ExpandedArraySize =
                 *(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize >> 2;
          }
        }
        else {
          uVar27._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar27._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar27 >> 0x29 & 1) == 0) {
            uVar28._0_4_ = pRestrictions_local->LockPitchAlignment;
            uVar28._4_4_ = pRestrictions_local->MinPitch;
            if ((uVar28 >> 0x28 & 1) != 0) {
              uVar1 = pRestrictions_local->RenderPitchAlignment;
              if (uVar1 == 0x20) {
                ExpandedArraySize = ExpandedArraySize >> 4;
              }
              else if (uVar1 == 0x40) {
                ExpandedArraySize = ExpandedArraySize >> 3;
              }
              else if (uVar1 == 0x80) {
                ExpandedArraySize = ExpandedArraySize >> 2;
              }
            }
          }
          else {
            uVar1 = pRestrictions_local->RenderPitchAlignment;
            if (uVar1 == 0x20) {
              ExpandedArraySize = ExpandedArraySize >> 3;
            }
            else if (uVar1 == 0x40) {
              ExpandedArraySize = ExpandedArraySize >> 2;
            }
            else if (uVar1 == 0x80) {
              ExpandedArraySize = ExpandedArraySize >> 1;
            }
          }
        }
      }
      else {
        ExpandedArraySize = ExpandedArraySize << 1;
      }
    }
    else {
      ExpandedArraySize = ExpandedArraySize / AlignedWidth;
    }
    local_138 = ExpandedArraySize * VAlign >> 3;
    if (local_138 <= _Height->MinPitch) {
      local_138 = _Height->MinPitch;
    }
    Status = (local_138 + (_Height->PitchAlignment - 1)) -
             (local_138 + (_Height->PitchAlignment - 1) & _Height->PitchAlignment - 1);
    if (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize != 0) {
      Status = (Status + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1)) -
               (Status + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1) &
               _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1);
      Pitch = (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight
                       - 1)) -
              (Pitch + (_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight
                       - 1) &
              _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1);
      uVar31._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar31._4_4_ = pRestrictions_local->MinPitch;
      if ((((uVar31 >> 0x23 & 1) != 0) ||
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x1b & 1) != 0)) &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) != 0)) {
        TRTileWidth = 0;
        TRTileHeight = 0;
        GmmTextureCalc::GmmGetD3DToHwTileConversion
                  ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,&TRTileWidth,
                   &TRTileHeight);
        iVar33 = _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth *
                 TRTileWidth;
        iVar34 = _Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight *
                 TRTileHeight;
        Status = (Status + iVar33 + -1) - (Status + iVar33 + -1 & iVar33 - 1U);
        Pitch = (Pitch + iVar34 + -1) - (Pitch + iVar34 + -1 & iVar34 - 1U);
      }
    }
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffffffff7fff | 0x8000;
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffffdffff;
    uVar32 = GmmIsYUVPacked(pRestrictions_local->PitchAlignment);
    if (((uVar32 != '\0') || (pRestrictions_local->RenderPitchAlignment == 0x60)) ||
       (pRestrictions_local->RenderPitchAlignment == 0x30)) {
      if (Status == GMM_SUCCESS) {
        local_13c = 0x10;
      }
      else {
        local_13c = (Status + 0xf) / Status;
      }
      Pitch = local_13c + 1 + Pitch;
    }
    Pitch = (Pitch + 1) - (Pitch + 1 & 1);
    pPlatform._0_4_ =
         GmmTextureCalc::FillTexPitchAndSize
                   ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,(ulong)Status,
                    Pitch,_Height);
    if ((GMM_STATUS)pPlatform == GMM_SUCCESS) {
      (*(this->super_GmmGen7TextureCalc).super_GmmTextureCalc._vptr_GmmTextureCalc[7])
                (this,pRestrictions_local);
      pRestrictions_local[1].Alignment = 0xf;
    }
    if ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 5 & 1) != 0) {
      lVar37 = pRestrictions_local[2].MinWidth *
               (ulong)_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight *
               (pRestrictions_local[3].MaxPitch /
               (pRestrictions_local[2].MinWidth *
               (ulong)_Height0->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight));
      pRestrictions_local[2].MaxHeight = pRestrictions_local[2].MaxHeight - lVar37;
      for (SkipMip0Tiles._4_4_ = 0; SkipMip0Tiles._4_4_ <= (uint)pRestrictions_local->MinWidth;
          SkipMip0Tiles._4_4_ = SkipMip0Tiles._4_4_ + 1) {
        *(long *)(&pRestrictions_local[3].MinPitch + (ulong)SkipMip0Tiles._4_4_ * 2) =
             *(long *)(&pRestrictions_local[3].MinPitch + (ulong)SkipMip0Tiles._4_4_ * 2) - lVar37;
      }
    }
    this_local._4_4_ = (GMM_STATUS)pPlatform;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen8TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) * // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil) ?
     1 :
     pTexInfo->MSAA.NumSamples); // MSAA (non-Depth/Stencil) RT samples stored as array planes.

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = 0;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = 0;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    // Calculate Block Surface Height
    /////////////////////////////////

    if(ExpandedArraySize > 1)
    {
        uint32_t Height0, Height1, Mip0BlockHeight, Slice0Delta = 0;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);
        Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

        Mip0BlockHeight = BlockHeight = (pTexInfo->MaxLod > 0) ?
                                        Height0 + Height1 + 12 * VAlign :
                                        Height0;
        BlockHeight -= (pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) ? Height0 : 0;

        if(pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d)
        {
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }

        // QPitch for compressed surface must be multiple of BlockHeight and 4...
        if(Compress && (CompressHeight % 4))
        {
            uint32_t LCM    = CompressHeight * ((CompressHeight % 2) ? 4 : 2);
            BlockHeight     = GFX_ALIGN_NP2(BlockHeight, LCM);
            Mip0BlockHeight = GFX_ALIGN_NP2(Mip0BlockHeight, LCM);
        }

        // Gen8 QPitch programming refers to the logical view, not physical.
        pTexInfo->Alignment.QPitch = BlockHeight;

        if(Compress)
        {
            BlockHeight /= CompressHeight;
            Mip0BlockHeight /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            BlockHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                BlockHeight /= 32;
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                BlockHeight /= 16;
            }
        }

        Slice0Delta = (pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) ? (Mip0BlockHeight - BlockHeight) : 0;
        BlockHeight *= ExpandedArraySize;
        BlockHeight += Slice0Delta;
    }
    else
    {
        pTexInfo->Alignment.QPitch = 0;

        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }

    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths
    // are greater than LOD0. e.g. dimensions 4x4 and MinPitch == 1
    if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);
        
	if((pGmmLibContext->GetWaTable().WaAstcCorruptionForOddCompressedBlockSizeX || pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips) && pPlatform->FormatTable[pTexInfo->Format].ASTC && CompressWidth == 5)
        {
            uint32_t Width1   = (Width == 1) ? 1 : (Width >> 1);
            uint32_t Modulo10 = Width1 % 10;
            if(Modulo10 >= 1 && Modulo10 <= CompressWidth)
            {
                AlignedWidthLod2 += 3 * CompressWidth;
            }
        }
        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth /= CompressWidth;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS)
    {
        if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    AlignedWidth /= 8;
                    break;
                case 64:
                    AlignedWidth /= 4;
                    break;
                case 128:
                    AlignedWidth /= 2;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }
        else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
        {
            switch(pTexInfo->BitsPerPixel)
            {
                case 32:
                    AlignedWidth /= 16;
                    break;
                case 64:
                    AlignedWidth /= 8;
                    break;
                case 128:
                    AlignedWidth /= 4;
                    break;
                default:
                    __GMM_ASSERT(0);
            }
        }
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);

    ////////////////////
    // Adjust for Tiling
    ////////////////////
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);

        // If Tiled Resource or Undefined64KBSwizzle resource, align to 64KB tile size
        if((pTexInfo->Flags.Gpu.TiledResource || pTexInfo->Flags.Info.Undefined64KBSwizzle) &&
           (pTexInfo->Flags.Info.TiledY))
        {
            uint32_t ColFactor = 0, RowFactor = 0;
            uint32_t TRTileWidth = 0, TRTileHeight = 0;

            GmmGetD3DToHwTileConversion(pTexInfo, &ColFactor, &RowFactor);
            TRTileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth * ColFactor;
            TRTileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight * RowFactor;

            Pitch       = GFX_ALIGN(Pitch, TRTileWidth);
            BlockHeight = GFX_ALIGN(BlockHeight, TRTileHeight);
        }
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over-fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);

        // Init to no-packed mips. It'll be initialized when app calls to get packed
        // mips. Calculate packed mips here if there's a chance apps won't call to
        // get packed mips.
        pTexInfo->Alignment.PackedMipStartLod = GMM_TILED_RESOURCE_NO_PACKED_MIPS;
    }

    if(pTexInfo->Flags.Wa.CHVAstcSkipVirtualMips)
    {
        uint32_t i             = 0;
        uint64_t SkipMip0Tiles = 0;
        SkipMip0Tiles          = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[1] /
                        (pTexInfo->Pitch * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        SkipMip0Tiles *= pTexInfo->Pitch * pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        pTexInfo->Size -= SkipMip0Tiles;
        for(i = 0; i <= pTexInfo->MaxLod; i++)
        {
            pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] -= SkipMip0Tiles;
        }
    }
    GMM_DPF_EXIT;

    return (Status);
}